

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O3

void generate_info_set(MppBufSlotsImpl *impl,MppFrame frame,RK_U32 force_def_align)

{
  MppFrame pvVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  MppFrame s;
  RK_U32 RVar6;
  RK_U32 RVar7;
  uint uVar8;
  uint uVar9;
  RK_U32 RVar10;
  MPP_RET MVar11;
  size_t v;
  MppFrameFormat MVar12;
  uint uVar13;
  char *fmt;
  int iVar14;
  RK_U32 RVar15;
  MppBufSlotsImpl *pMVar16;
  RK_U32 RVar17;
  ulong uVar18;
  ulong uVar19;
  MppSysCfg cfg;
  MppBufSlotInfoSet sys_cfg_info_set;
  MppSysCfg local_88;
  ulong local_80;
  RK_U32 local_78;
  RK_U32 local_74;
  RK_U32 local_70;
  uint local_6c;
  MppFrameFormat local_68;
  MppFrameFormat local_64;
  ulong local_60;
  RK_U32 local_54;
  RK_U32 local_50;
  RK_U32 local_4c;
  ulong local_48;
  MppBufSlotsImpl *local_40;
  MppFrame local_38;
  
  local_60 = CONCAT44(local_60._4_4_,force_def_align);
  local_50 = mpp_frame_get_width(frame);
  local_4c = mpp_frame_get_height(frame);
  local_64 = mpp_frame_get_fmt(frame);
  RVar6 = mpp_frame_get_width(frame);
  RVar7 = mpp_frame_get_height(frame);
  local_68 = mpp_frame_get_fmt(frame);
  MVar12 = local_68 & 0xfffff;
  local_80 = (ulong)MVar12;
  iVar14 = 10;
  if ((MVar12 | MPP_FMT_YUV422SP) != MPP_FMT_YUV422SP_10BIT) {
    iVar14 = (uint)(MVar12 == MPP_FMT_YUV444SP_10BIT) * 2 + 8;
  }
  uVar8 = mpp_frame_get_hor_stride(frame);
  local_38 = frame;
  uVar9 = mpp_frame_get_ver_stride(frame);
  RVar10 = RVar6;
  if (impl->hal_width_align != (AlignFunc)0x0) {
    RVar10 = (*impl->hal_width_align)(RVar6);
  }
  uVar13 = RVar10 * iVar14 >> 3;
  if (uVar8 != 0) {
    uVar13 = uVar8;
  }
  RVar10 = (*impl->hal_hor_align)(uVar13);
  if (uVar8 == 0) {
    uVar8 = RVar10;
  }
  if (uVar9 != 0) {
    RVar7 = uVar9;
  }
  local_40 = impl;
  RVar7 = (*impl->hal_ver_align)(RVar7);
  s = local_38;
  pMVar16 = local_40;
  if (uVar9 == 0) {
    uVar9 = RVar7;
  }
  if ((int)local_60 == 0) {
    uVar9 = RVar7;
    uVar8 = RVar10;
  }
  local_60 = (ulong)uVar9;
  if ((local_68 & 0xf00000) != MPP_FMT_YUV420SP) {
    if (*compat_ext_fbc_hdr_256_odd == 0) {
      uVar8 = RVar6 + 0x3f & 0xffffffc0;
    }
    else {
      uVar8 = RVar6 + 0xff & 0xfffffe00 | 0x100;
    }
    uVar8 = iVar14 * uVar8 >> 3;
  }
  local_48 = (ulong)uVar8;
  uVar13 = (uint)local_80;
  if (uVar13 < 0x12) {
    if ((0x2000aU >> (uVar13 & 0x1f) & 1) == 0) {
      if ((0x300U >> (uVar13 & 0x1f) & 1) == 0) goto LAB_0012fc47;
      goto LAB_0012fc73;
    }
    uVar18 = (ulong)(uVar8 * 8) / 10;
  }
  else {
LAB_0012fc47:
    if (uVar13 - 0x10000 < 2) {
LAB_0012fc73:
      uVar18 = (ulong)(uVar8 >> 1);
    }
    else {
      uVar18 = local_48;
      if (uVar13 - 0x10006 < 2) {
        uVar18 = local_48 / 3;
      }
    }
  }
  RVar7 = uVar8 * uVar9;
  if ((local_68 & 0xf00000) == MPP_FMT_YUV420SP) {
    if (local_40->hal_len_align == (AlignFunc)0x0) {
      RVar7 = (RVar7 * local_40->numerator) / local_40->denominator;
    }
    else {
      RVar7 = (*local_40->hal_len_align)(RVar7);
    }
    local_80 = CONCAT44(local_80._4_4_,RVar7);
  }
  else {
    uVar8 = (int)uVar18 + 0x3fU & 0xffffffc0;
    uVar18 = (ulong)uVar8;
    switch(local_80 & 0xffffffff) {
    case 0:
      uVar8 = (uVar9 + 0xf & 0xfffffff0) * uVar8;
      iVar14 = ((int)uVar8 >> 8) * 3;
      break;
    case 1:
    case 2:
      iVar14 = (uVar9 + 0xf & 0xfffffff0) * uVar8;
      uVar8 = (iVar14 >> 4) + iVar14 * 2;
      goto LAB_0012fd79;
    case 3:
      uVar8 = (uVar9 + 0xf & 0xfffffff0) * uVar8;
      iVar14 = ((int)uVar8 >> 8) * 5;
      break;
    default:
      if (uVar13 != 0xf) {
        if (uVar13 == 0x11) {
          iVar14 = (uVar9 + 0xf & 0xfffffff0) * uVar8;
          uVar8 = (iVar14 >> 4) + iVar14 * 4;
        }
        else {
          uVar8 = RVar7 * 3 >> 1;
          _mpp_log_l(2,"mpp_buf_slot","dec out fmt is no support",(char *)0x0);
        }
        goto LAB_0012fd79;
      }
      uVar8 = (uVar9 + 0xf & 0xfffffff0) * uVar8;
      iVar14 = (uVar8 >> 8) * 0x300;
      goto LAB_0012fd77;
    }
    iVar14 = iVar14 << 7;
LAB_0012fd77:
    uVar8 = iVar14 + ((int)uVar8 >> 4);
LAB_0012fd79:
    local_80 = CONCAT44(local_80._4_4_,uVar8);
    mpp_frame_set_fbc_size(s,(long)(int)uVar8);
  }
  RVar7 = mpp_frame_get_width(s);
  local_54 = mpp_frame_get_height(s);
  local_68 = mpp_frame_get_hor_stride(s);
  RVar6 = mpp_frame_get_ver_stride(s);
  MVar12 = mpp_frame_get_fmt(s);
  MVar11 = mpp_sys_cfg_get(&local_88);
  if (MVar11 == MPP_OK) {
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:enable",1);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:type",pMVar16->coding_type);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:fmt_codec",MVar12 & 0xfffff);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:fmt_fbc",MVar12 & 0xf00000);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:fmt_hdr",MVar12 & 0xc000000);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:width",RVar7);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:height",local_54);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:h_stride_by_byte",local_68);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:v_stride",RVar6);
    mpp_sys_cfg_ioctl(local_88);
    pMVar16 = local_40;
    mpp_sys_cfg_get_u32(local_88,"dec_buf_chk:h_stride_by_byte",&local_74);
    mpp_sys_cfg_get_u32(local_88,"dec_buf_chk:h_stride_by_pixel",&local_78);
    mpp_sys_cfg_get_u32(local_88,"dec_buf_chk:v_stride",&local_70);
    mpp_sys_cfg_get_u32(local_88,"dec_buf_chk:size_total",&local_6c);
    MVar11 = mpp_sys_cfg_put(local_88);
    uVar19 = local_48;
    if (MVar11 != MPP_OK) {
      fmt = "mpp_sys_cfg_put failed\n";
      goto LAB_0012ff17;
    }
  }
  else {
    fmt = "mpp_sys_cfg_get failed\n";
LAB_0012ff17:
    uVar19 = local_48;
    _mpp_log_l(2,"mpp_buf_slot",fmt,(char *)0x0);
  }
  mpp_frame_set_width(pMVar16->info_set,local_50);
  mpp_frame_set_height(pMVar16->info_set,local_4c);
  mpp_frame_set_fmt(pMVar16->info_set,local_64);
  RVar7 = use_legacy_align;
  RVar10 = (RK_U32)uVar19;
  RVar6 = RVar10;
  if (use_legacy_align == 0) {
    RVar6 = local_74;
  }
  mpp_frame_set_hor_stride(pMVar16->info_set,RVar6);
  RVar6 = (RK_U32)local_60;
  if (RVar7 == 0) {
    RVar6 = local_70;
  }
  mpp_frame_set_ver_stride(pMVar16->info_set,RVar6);
  RVar17 = (RK_U32)uVar18;
  RVar6 = RVar17;
  if (RVar7 == 0) {
    RVar6 = local_78;
  }
  mpp_frame_set_hor_stride_pixel(pMVar16->info_set,RVar6);
  uVar9 = (uint)local_80;
  uVar8 = local_6c;
  if (RVar7 != 0) {
    uVar8 = (uint)local_80;
  }
  mpp_frame_set_buf_size(pMVar16->info_set,(ulong)uVar8);
  uVar8 = local_6c;
  if (RVar7 != 0) {
    uVar8 = uVar9;
  }
  mpp_frame_set_buf_size(s,(ulong)uVar8);
  RVar6 = RVar10;
  if (RVar7 == 0) {
    RVar6 = local_74;
  }
  mpp_frame_set_hor_stride(s,RVar6);
  uVar5 = local_60;
  RVar15 = (RK_U32)local_60;
  RVar6 = RVar15;
  if (RVar7 == 0) {
    RVar6 = local_70;
  }
  mpp_frame_set_ver_stride(s,RVar6);
  RVar6 = RVar17;
  if (RVar7 == 0) {
    RVar6 = local_78;
  }
  mpp_frame_set_hor_stride_pixel(s,RVar6);
  uVar9 = (uint)local_80;
  uVar8 = local_6c;
  if (RVar7 != 0) {
    uVar8 = (uint)local_80;
  }
  pMVar16->buf_size = (ulong)uVar8;
  RVar7 = mpp_frame_get_thumbnail_en(s);
  if (RVar7 != 1) goto LAB_001300dc;
  RVar7 = mpp_frame_get_height(s);
  RVar6 = mpp_frame_get_width(s);
  uVar8 = ((RVar6 >> 1) + 0xf & 0xffffff0) * ((RVar7 >> 1) + 0xf & 0xfffffff0);
  MVar12 = local_64 & 0xfffff;
  uVar9 = (uint)local_80;
  if (MVar12 < MPP_FMT_YUV400) {
    if (MVar12 < MPP_FMT_YUV422SP) {
      uVar8 = uVar8 * 3 >> 1;
    }
    else if (MVar12 - MPP_FMT_YUV422SP < 2) {
      uVar8 = uVar8 * 2;
    }
    else {
LAB_001300ae:
      uVar8 = uVar8 * 3 >> 1;
    }
  }
  else if (MVar12 != MPP_FMT_YUV400) {
    if ((MVar12 != MPP_FMT_YUV444SP) && (MVar12 != MPP_FMT_YUV444SP_10BIT)) goto LAB_001300ae;
    uVar8 = uVar8 * 3;
  }
  v = (ulong)uVar8 + pMVar16->buf_size;
  pMVar16->buf_size = v;
  mpp_frame_set_buf_size(pMVar16->info_set,v);
  mpp_frame_set_buf_size(s,pMVar16->buf_size);
LAB_001300dc:
  pvVar1 = pMVar16->info_set;
  uVar2 = *(undefined4 *)((long)s + 0x58);
  uVar3 = *(undefined4 *)((long)s + 0x5c);
  uVar4 = *(undefined4 *)((long)s + 0x60);
  *(undefined4 *)((long)pvVar1 + 0x54) = *(undefined4 *)((long)s + 0x54);
  *(undefined4 *)((long)pvVar1 + 0x58) = uVar2;
  *(undefined4 *)((long)pvVar1 + 0x5c) = uVar3;
  *(undefined4 *)((long)pvVar1 + 0x60) = uVar4;
  *(undefined4 *)((long)pvVar1 + 100) = *(undefined4 *)((long)s + 100);
  if (pMVar16->align_chk_log_en != 0) {
    pMVar16->align_chk_log_en = 0;
    if (RVar17 != local_78) {
      _mpp_log_l(4,"mpp_buf_slot","mismatch h_stride_by_pixel %d - %d\n",(char *)0x0,uVar18);
    }
    if (RVar10 != local_74) {
      _mpp_log_l(4,"mpp_buf_slot","mismatch h_stride_by_byte %d - %d\n",(char *)0x0,
                 uVar19 & 0xffffffff);
    }
    if (RVar15 != local_70) {
      _mpp_log_l(4,"mpp_buf_slot","mismatch v_stride %d - %d\n",(char *)0x0,uVar5 & 0xffffffff);
    }
    if (uVar9 != local_6c) {
      _mpp_log_l(4,"mpp_buf_slot","mismatch size_total %d - %d\n",(char *)0x0,(ulong)uVar9);
    }
  }
  return;
}

Assistant:

static void generate_info_set(MppBufSlotsImpl *impl, MppFrame frame, RK_U32 force_def_align)
{
    const RK_U32 width  = mpp_frame_get_width(frame);
    const RK_U32 height = mpp_frame_get_height(frame);
    const MppFrameFormat fmt = mpp_frame_get_fmt(frame);
    MppBufSlotInfoSet legacy_info_set;
    MppBufSlotInfoSet sys_cfg_info_set;
    MppBufSlotInfoSet *info_set_ptr = NULL;
    MppFrameImpl *info_set_impl = NULL;
    MppFrameImpl *frame_impl = NULL;

    prepare_info_set_legacy(impl, frame, &legacy_info_set, force_def_align);
    prepare_info_set_by_sys_cfg(impl, frame, &sys_cfg_info_set);

    mpp_frame_set_width(impl->info_set, width);
    mpp_frame_set_height(impl->info_set, height);
    mpp_frame_set_fmt(impl->info_set, fmt);
    info_set_ptr = use_legacy_align ? &legacy_info_set : &sys_cfg_info_set;
    mpp_frame_set_hor_stride(impl->info_set, info_set_ptr->h_stride_by_byte);
    mpp_frame_set_ver_stride(impl->info_set, info_set_ptr->v_stride);
    mpp_frame_set_hor_stride_pixel(impl->info_set, info_set_ptr->h_stride_by_pixel);
    mpp_frame_set_buf_size(impl->info_set, info_set_ptr->size_total);
    mpp_frame_set_buf_size(frame, info_set_ptr->size_total);
    mpp_frame_set_hor_stride(frame, info_set_ptr->h_stride_by_byte);
    mpp_frame_set_ver_stride(frame, info_set_ptr->v_stride);
    mpp_frame_set_hor_stride_pixel(frame, info_set_ptr->h_stride_by_pixel);
    impl->buf_size = info_set_ptr->size_total;

    if (mpp_frame_get_thumbnail_en(frame) == MPP_FRAME_THUMBNAIL_MIXED) {
        /*
         * The decode hw only support 1/2 scaling in width and height,
         * downscale output image only support raster mode with 8bit depth.
         */
        RK_U32 down_scale_ver = MPP_ALIGN(mpp_frame_get_height(frame) >> 1, 16);
        RK_U32 down_scale_hor = MPP_ALIGN(mpp_frame_get_width(frame) >> 1, 16);
        RK_U32 downscale_buf_size;
        RK_U32 down_scale_y_virstride = down_scale_ver * down_scale_hor;

        switch ((fmt & MPP_FRAME_FMT_MASK)) {
        case MPP_FMT_YUV400 : {
            downscale_buf_size = down_scale_y_virstride;
        } break;
        case MPP_FMT_YUV420SP_10BIT :
        case MPP_FMT_YUV420SP : {
            downscale_buf_size = down_scale_y_virstride * 3 / 2;
        } break;
        case MPP_FMT_YUV422SP_10BIT :
        case MPP_FMT_YUV422SP : {
            downscale_buf_size = down_scale_y_virstride * 2;
        } break;
        case MPP_FMT_YUV444SP_10BIT :
        case MPP_FMT_YUV444SP : {
            downscale_buf_size = down_scale_y_virstride * 3;
        } break;
        default : {
            downscale_buf_size = down_scale_y_virstride * 3 / 2;
        } break;
        }
        downscale_buf_size = MPP_ALIGN(downscale_buf_size, 16);
        impl->buf_size += downscale_buf_size;
        mpp_frame_set_buf_size(impl->info_set, impl->buf_size);
        mpp_frame_set_buf_size(frame, impl->buf_size);
    }
    info_set_impl = (MppFrameImpl *)impl->info_set;
    frame_impl    = (MppFrameImpl *)frame;
    info_set_impl->color_range      = frame_impl->color_range;
    info_set_impl->color_primaries  = frame_impl->color_primaries;
    info_set_impl->color_trc        = frame_impl->color_trc;
    info_set_impl->colorspace       = frame_impl->colorspace;
    info_set_impl->chroma_location  = frame_impl->chroma_location;

    if (impl->align_chk_log_en) {
        impl->align_chk_log_en = 0;
        if (legacy_info_set.h_stride_by_pixel != sys_cfg_info_set.h_stride_by_pixel)
            mpp_logi("mismatch h_stride_by_pixel %d - %d\n",
                     legacy_info_set.h_stride_by_pixel,
                     sys_cfg_info_set.h_stride_by_pixel);
        if (legacy_info_set.h_stride_by_byte != sys_cfg_info_set.h_stride_by_byte)
            mpp_logi("mismatch h_stride_by_byte %d - %d\n",
                     legacy_info_set.h_stride_by_byte,
                     sys_cfg_info_set.h_stride_by_byte);
        if (legacy_info_set.v_stride != sys_cfg_info_set.v_stride)
            mpp_logi("mismatch v_stride %d - %d\n",
                     legacy_info_set.v_stride,
                     sys_cfg_info_set.v_stride);
        if (legacy_info_set.size_total != sys_cfg_info_set.size_total)
            mpp_logi("mismatch size_total %d - %d\n",
                     legacy_info_set.size_total,
                     sys_cfg_info_set.size_total);
    }
}